

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Attribute_Access<std::function<int_(int)>,_TestBaseType>::Attribute_Access
          (Attribute_Access<std::function<int_(int)>,_TestBaseType> *this,
          offset_in_TestBaseType_to_function<int_(int)> t_attr)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator<chaiscript::Type_Info> local_79;
  Type_Info local_78;
  pointer_____offset_0x10___ *ppuStack_60;
  pointer_____offset_0x10___ *local_58;
  undefined8 uStack_50;
  iterator local_40;
  size_type local_38;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  offset_in_TestBaseType_to_function<int_(int)> local_18;
  offset_in_TestBaseType_to_function<int_(int)> t_attr_local;
  Attribute_Access<std::function<int_(int)>,_TestBaseType> *this_local;
  
  local_18 = t_attr;
  t_attr_local = (offset_in_TestBaseType_to_function<int_(int)>)this;
  param_types();
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_30,1);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_30);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Attribute_Access_002d8ea8;
  local_58 = &TestBaseType::typeinfo;
  uStack_50 = 0;
  local_78.m_flags = 0;
  local_78._20_4_ = 0;
  ppuStack_60 = &TestBaseType::typeinfo;
  local_78.m_type_info = (type_info *)&std::function<int(int)>::typeinfo;
  local_78.m_bare_type_info = (type_info *)&std::function<int(int)>::typeinfo;
  local_40 = &local_78;
  local_38 = 2;
  std::allocator<chaiscript::Type_Info>::allocator(&local_79);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&this->m_param_types,__l,&local_79);
  std::allocator<chaiscript::Type_Info>::~allocator(&local_79);
  this->m_attr = local_18;
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }